

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImFont * __thiscall ImFontAtlas::AddFontDefault(ImFontAtlas *this,ImFontConfig *font_cfg_template)

{
  char *pcVar1;
  ImFont *pIVar2;
  void *in_RSI;
  ImFontAtlas *in_RDI;
  ImFont *font;
  ImWchar *glyph_ranges;
  char *ttf_compressed_base85;
  ImFontConfig font_cfg;
  ImFontConfig *local_c0;
  ImFontConfig *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff68;
  ImFontAtlas *in_stack_ffffffffffffff70;
  float local_84;
  ImFontConfig *local_60;
  char local_42 [66];
  float size_pixels;
  
  if (in_RSI == (void *)0x0) {
    ImFontConfig::ImFontConfig(in_stack_ffffffffffffff50);
  }
  else {
    memcpy(&stack0xffffffffffffff68,in_RSI,0x88);
  }
  if (local_84 <= 0.0) {
    local_84 = 13.0;
  }
  if (local_42[0] == '\0') {
    ImFormatString(local_42,0x28,"ProggyClean.ttf, %dpx",(ulong)(uint)(int)local_84);
  }
  pcVar1 = GetDefaultCompressedFontDataTTFBase85();
  size_pixels = (float)((ulong)pcVar1 >> 0x20);
  if (local_60 == (ImFontConfig *)0x0) {
    local_c0 = (ImFontConfig *)GetGlyphRangesDefault(in_RDI);
  }
  else {
    local_c0 = local_60;
  }
  pIVar2 = AddFontFromMemoryCompressedBase85TTF
                     (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,size_pixels,local_c0,
                      (ImWchar *)in_stack_ffffffffffffff50);
  (pIVar2->DisplayOffset).y = 1.0;
  return pIVar2;
}

Assistant:

ImFont* ImFontAtlas::AddFontDefault(const ImFontConfig* font_cfg_template)
{
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    if (!font_cfg_template)
    {
        font_cfg.OversampleH = font_cfg.OversampleV = 1;
        font_cfg.PixelSnapH = true;
    }
    if (font_cfg.SizePixels <= 0.0f)
        font_cfg.SizePixels = 13.0f * 1.0f;
    if (font_cfg.Name[0] == '\0')
        ImFormatString(font_cfg.Name, IM_ARRAYSIZE(font_cfg.Name), "ProggyClean.ttf, %dpx", (int)font_cfg.SizePixels);
    font_cfg.EllipsisChar = (ImWchar)0x0085;

    const char* ttf_compressed_base85 = GetDefaultCompressedFontDataTTFBase85();
    const ImWchar* glyph_ranges = font_cfg.GlyphRanges != NULL ? font_cfg.GlyphRanges : GetGlyphRangesDefault();
    ImFont* font = AddFontFromMemoryCompressedBase85TTF(ttf_compressed_base85, font_cfg.SizePixels, &font_cfg, glyph_ranges);
    font->DisplayOffset.y = 1.0f;
    return font;
}